

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O2

void __thiscall
Assimp::FindDegeneratesProcess::Execute(FindDegeneratesProcess *this,aiScene *pScene)

{
  aiMesh *this_00;
  aiMesh **ppaVar1;
  bool bVar2;
  Logger *pLVar3;
  ulong uVar4;
  uint i;
  uint index;
  ulong uVar5;
  
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FindDegeneratesProcess begin");
  for (index = 0; index < pScene->mNumMeshes; index = index + 1) {
    uVar5 = (ulong)index;
    if (pScene->mMeshes[uVar5]->mPrimitiveTypes != 1) {
      bVar2 = ExecuteOnMesh(this,pScene->mMeshes[uVar5]);
      if (bVar2) {
        this_00 = pScene->mMeshes[uVar5];
        while( true ) {
          uVar4 = (ulong)(pScene->mNumMeshes - 1);
          ppaVar1 = pScene->mMeshes;
          if (uVar4 <= uVar5) break;
          ppaVar1[uVar5] = ppaVar1[uVar5 + 1];
          uVar5 = uVar5 + 1;
        }
        ppaVar1[uVar4] = (aiMesh *)0x0;
        pScene->mNumMeshes = pScene->mNumMeshes - 1;
        if (this_00 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(this_00);
        }
        operator_delete(this_00);
        updateSceneGraph(pScene->mRootNode,index);
        index = index - 1;
      }
    }
  }
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"FindDegeneratesProcess finished");
  return;
}

Assistant:

void FindDegeneratesProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess begin");
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
    {
        //Do not process point cloud, ExecuteOnMesh works only with faces data
        if ((pScene->mMeshes[i]->mPrimitiveTypes != aiPrimitiveType::aiPrimitiveType_POINT) && ExecuteOnMesh(pScene->mMeshes[i])) {
            removeMesh(pScene, i);
            --i; //the current i is removed, do not skip the next one
        }
    }
    ASSIMP_LOG_DEBUG("FindDegeneratesProcess finished");
}